

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O3

void fftFree(void)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0x1f;
  do {
    if (BRLowArray[lVar1] != (short *)0x0) {
      free(BRLowArray[lVar1]);
      BRLowArray[lVar1] = (short *)0x0;
    }
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  lVar1 = 0x3f;
  do {
    if (UtblArray[lVar1] != (float *)0x0) {
      free(UtblArray[lVar1]);
      UtblArray[lVar1] = (float *)0x0;
    }
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  return;
}

Assistant:

void fftFree(){
// release storage for all private cosine and bit reversed tables
long i1;
for (i1=8*sizeof(long)/2-1; i1>=0; i1--){
	if (BRLowArray[i1] != 0){
		free(BRLowArray[i1]);
		BRLowArray[i1] = 0;
	};
};
for (i1=8*sizeof(long)-1; i1>=0; i1--){
	if (UtblArray[i1] != 0){
		free(UtblArray[i1]);
		UtblArray[i1] = 0;
	};
};
}